

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_15::IsInCorrectFormForGCDTest(SENode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ChildContainerType *this;
  reference ppSVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  bool bVar4;
  bool local_43;
  bool local_42;
  bool this_ok;
  SENode *child;
  iterator __end3;
  iterator __begin3;
  ChildContainerType *__range3;
  SEAddNode *add_node;
  bool children_ok;
  SENode *node_local;
  
  bVar4 = true;
  iVar2 = (*node->_vptr_SENode[8])();
  if ((SENode *)CONCAT44(extraout_var,iVar2) != (SENode *)0x0) {
    this = SENode::GetChildren((SENode *)CONCAT44(extraout_var,iVar2));
    __end3 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::begin
                       (this);
    child = (SENode *)
            std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::end
                      (this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                       *)&child), bVar1) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                ::operator*(&__end3);
      bVar1 = IsInCorrectFormForGCDTest(*ppSVar3);
      bVar4 = (bVar4 & bVar1) != 0;
      __gnu_cxx::
      __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
      ::operator++(&__end3);
    }
  }
  iVar2 = (*node->_vptr_SENode[6])();
  local_42 = true;
  if (CONCAT44(extraout_var_00,iVar2) == 0) {
    iVar2 = (*node->_vptr_SENode[8])();
    local_42 = true;
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      iVar2 = (*node->_vptr_SENode[4])();
      local_42 = CONCAT44(extraout_var_02,iVar2) != 0;
    }
  }
  local_43 = false;
  if (bVar4 != false) {
    local_43 = local_42;
  }
  return local_43;
}

Assistant:

bool IsInCorrectFormForGCDTest(SENode* node) {
  bool children_ok = true;

  if (auto add_node = node->AsSEAddNode()) {
    for (auto child : add_node->GetChildren()) {
      children_ok &= IsInCorrectFormForGCDTest(child);
    }
  }

  bool this_ok = node->AsSERecurrentNode() || node->AsSEAddNode() ||
                 node->AsSEConstantNode();

  return children_ok && this_ok;
}